

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

size_t really_read(int sock,void *in,size_t count)

{
  ssize_t sVar1;
  ostream *poVar2;
  vw_exception *this;
  ostream *poVar3;
  string *pmessage;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong in_RDX;
  void *in_RSI;
  int in_EDI;
  char __errmsg [256];
  stringstream __msg;
  int r;
  size_t done;
  char *buf;
  int plineNumber;
  char local_2d8 [280];
  stringstream local_1c0 [16];
  ostream local_1b0;
  int local_34;
  ulong local_30;
  void *local_28;
  ulong local_20;
  int local_c;
  
  local_30 = 0;
  local_34 = 0;
  local_28 = in_RSI;
  local_20 = in_RDX;
  local_c = in_EDI;
  while( true ) {
    if (local_20 <= local_30) {
      return local_30;
    }
    sVar1 = read(local_c,local_28,(ulong)(uint)((int)local_20 - (int)local_30));
    local_34 = (int)sVar1;
    if (local_34 == 0) break;
    if (local_34 < 0) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      poVar2 = std::operator<<(&local_1b0,"read(");
      this = (vw_exception *)std::ostream::operator<<(poVar2,local_c);
      poVar2 = std::operator<<((ostream *)this,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar2,local_20);
      pmessage = (string *)std::operator<<(poVar3,"-");
      plineNumber = (int)((ulong)poVar3 >> 0x20);
      poVar3 = (ostream *)std::ostream::operator<<(pmessage,local_30);
      std::operator<<(poVar3,")");
      piVar4 = __errno_location();
      pcVar5 = strerror_r(*piVar4,local_2d8,0x100);
      if (pcVar5 == (char *)0x0) {
        poVar3 = std::operator<<(&local_1b0,"errno = ");
        std::operator<<(poVar3,local_2d8);
      }
      else {
        std::operator<<(&local_1b0,"errno = unknown");
      }
      uVar6 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception(this,(char *)poVar2,plineNumber,pmessage);
      __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_30 = (long)local_34 + local_30;
    local_28 = (void *)((long)local_28 + (long)local_34);
  }
  return 0;
}

Assistant:

size_t really_read(int sock, void* in, size_t count)
{
  char* buf = (char*)in;
  size_t done = 0;
  int r = 0;
  while (done < count)
  {
    if ((r =
#ifdef _WIN32
                recv(sock, buf, (unsigned int)(count - done), 0)
#else
                read(sock, buf, (unsigned int)(count - done))
#endif
                ) == 0)
      return 0;
    else if (r < 0)
    {
      THROWERRNO("read(" << sock << "," << count << "-" << done << ")");
    }
    else
    {
      done += r;
      buf += r;
    }
  }
  return done;
}